

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR FILEGetLastErrorFromErrnoAndFilename(LPSTR lpPath)

{
  DWORD DVar1;
  int *piVar2;
  PAL_ERROR local_1c [2];
  PAL_ERROR palError;
  
  piVar2 = __errno_location();
  if (*piVar2 == 2) {
    FILEGetProperNotFoundError(lpPath,local_1c);
    return local_1c[0];
  }
  DVar1 = FILEGetLastErrorFromErrno();
  return DVar1;
}

Assistant:

PAL_ERROR FILEGetLastErrorFromErrnoAndFilename(LPSTR lpPath)
{
    PAL_ERROR palError;
    if (ENOENT == errno)
    {
        FILEGetProperNotFoundError(lpPath, &palError);
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    return palError;
}